

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::genTestRects
               (vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *rects,int width,
               int height)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  Vector<int,_4> local_40;
  
  bVar2 = 0;
  iVar3 = width;
  iVar1 = height;
  while( true ) {
    local_40.m_data[0] = width - iVar3;
    local_40.m_data[1] = height - iVar1;
    local_40.m_data[2] = iVar3;
    local_40.m_data[3] = iVar1;
    std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>::
    emplace_back<tcu::Vector<int,4>>
              ((vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>> *)rects,&local_40);
    if (iVar1 == 1 && iVar3 == 1) break;
    if ((iVar1 < 2) || ((iVar3 != 1 && ((bool)(bVar2 & 1))))) {
      iVar3 = iVar3 + -1;
    }
    else {
      iVar1 = iVar1 + -1;
    }
    bVar2 = bVar2 + 1;
  }
  return;
}

Assistant:

static void genTestRects (vector<IVec4>& rects, int width, int height)
{
	int curWidth	= width;
	int curHeight	= height;
	int ndx			= 0;

	for (;;)
	{
		rects.push_back(IVec4(width-curWidth, height-curHeight, curWidth, curHeight));

		DE_ASSERT(curWidth >= 1 && curHeight >= 1);
		if (curWidth == 1 && curHeight == 1)
			break;
		else if (curHeight > 1 && ((ndx%2) == 0 || curWidth == 1))
			curHeight -= 1;
		else
			curWidth -= 1;

		ndx += 1;
	}
}